

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3RealSameAsInt(double r1,sqlite3_int64 i)

{
  bool local_22;
  bool local_21;
  double r2;
  sqlite3_int64 i_local;
  double r1_local;
  
  local_21 = true;
  if ((r1 != 0.0) || (NAN(r1))) {
    local_22 = false;
    if ((r1 == (double)i) && (local_22 = false, -0x8000000000001 < i)) {
      local_22 = i < 0x8000000000000;
    }
    local_21 = local_22;
  }
  return (int)local_21;
}

Assistant:

SQLITE_PRIVATE int sqlite3RealSameAsInt(double r1, sqlite3_int64 i){
  double r2 = (double)i;
  return r1==0.0
      || (memcmp(&r1, &r2, sizeof(r1))==0
          && i >= -2251799813685248LL && i < 2251799813685248LL);
}